

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O3

int QCollator::defaultCompare(QStringView s1,QStringView s2)

{
  GenerationalCollator *this;
  int iVar1;
  Type *this_00;
  void **ppvVar2;
  QCollator *this_01;
  
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::
            operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>
                        *)s1.m_size);
  ppvVar2 = QThreadStorageData::get(&this_00->d);
  if (ppvVar2 == (void **)0x0) {
    this_01 = (QCollator *)operator_new(0x10);
    this_01->d = (QCollatorPrivate *)0x0;
    this_01[1].d = (QCollatorPrivate *)0x0;
    QCollator(this_01);
    *(Type *)&this_01[1].d = QLocalePrivate::s_generation._q_value.super___atomic_base<int>._M_i;
    ppvVar2 = QThreadStorageData::set(&this_00->d,this_01);
  }
  this = (GenerationalCollator *)*ppvVar2;
  anon_unknown.dwarf_be581e::GenerationalCollator::collator(this);
  iVar1 = compare((QCollator *)this,s1,s2);
  return iVar1;
}

Assistant:

int QCollator::defaultCompare(QStringView s1, QStringView s2)
{
    return defaultCollator->localData().collator().compare(s1, s2);
}